

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O3

bool __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
          (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->b_mutex;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  iVar1 = this->b_size;
  iVar2 = this->capacity;
  if (iVar1 < iVar2) {
    iVar3 = (this->b_last + 1) % iVar2;
    this->b_last = iVar3;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this->b_array + iVar3,item);
    this->b_size = this->b_size + 1;
    if (this->b_debug == true) {
      this->b_wcnt = this->b_wcnt + 1;
    }
  }
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return iVar1 < iVar2;
}

Assistant:

bool push(const T &item)
    {
        unique_lock<mutex> lck (b_mutex);;
        if (b_size >= capacity)
        {
            b_cond.notify_all();            
            return false;
        }

        b_last = (b_last + 1) % capacity;
        b_array[b_last] = item;

        b_size++;
        if(b_debug)
        {
            b_wcnt++;
        }
        b_cond.notify_all();
        
        return true;
    }